

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynchronizedQueue.h
# Opt level: O2

void __thiscall SynchronizedQueue<Buffer>::put(SynchronizedQueue<Buffer> *this,Buffer *value)

{
  size_type sVar1;
  __sighandler_t __handler;
  
  Semaphore::p((Semaphore *)this);
  std::deque<Buffer,_std::allocator<Buffer>_>::push_back(&(this->values).c,value);
  sVar1 = std::deque<Buffer,_std::allocator<Buffer>_>::size(&(this->values).c);
  if (sVar1 == 1) {
    Monitor::signal(&this->super_Monitor,(int)this + 0x70,__handler);
  }
  Semaphore::v((Semaphore *)this);
  return;
}

Assistant:

void SynchronizedQueue<T>::put(T value) {
    enter();
    values.push(value);
    if (values.size() == 1) {
        signal(isEmpty);
    }
    leave();
}